

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  long lVar3;
  anon_class_56_7_7e142ac4 __f;
  path *ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  path *ppVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  long lVar11;
  ostream *poVar12;
  pointer pcVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  undefined8 in_R8;
  undefined8 in_R9;
  path *d;
  long lVar17;
  difference_type __d;
  element_type *peVar18;
  element_type *peVar19;
  type_conflict tVar20;
  double dVar21;
  undefined1 auVar22 [16];
  char *pcVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<double,_std::allocator<double>_> v;
  string output_dir;
  recursive_directory_iterator __end1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  vector<double,_std::allocator<double>_> v2;
  string mkdir_command;
  ofstream output_file;
  ifstream f;
  undefined1 *puVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 *puVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar28;
  undefined1 *puVar29;
  element_type *in_stack_fffffffffffffab0;
  element_type *peVar30;
  element_type *in_stack_fffffffffffffab8;
  element_type *peVar31;
  pointer in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  undefined8 in_stack_fffffffffffffad0;
  _Alloc_hider _Var32;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffae0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_4e8;
  vector<double,_std::allocator<double>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  double local_498;
  recursive_directory_iterator local_490;
  recursive_directory_iterator local_480;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_470;
  undefined1 local_458 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  undefined1 *puStack_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  vector<double,_std::allocator<double>_> *pvStack_430;
  undefined8 local_428;
  ios_base local_360 [264];
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_258;
  path local_238 [13];
  
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458 = (undefined1  [8])getenv("HOME");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (local_238,(char **)local_458,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&stack0xfffffffffffffad8,local_238,none,
             (error_code *)0x0);
  std::filesystem::__cxx11::path::~path(local_238);
  if (in_stack_fffffffffffffae0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
    }
  }
  local_480._M_dirs._M_ptr = (element_type *)0x0;
  local_480._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b8._M_string_length = (size_type)in_stack_fffffffffffffae0._M_pi;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_480);
  if (in_stack_fffffffffffffae0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
    }
  }
  local_508._M_dataplus._M_p = (pointer)0x0;
  local_508._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_490);
  paVar1 = &local_238[0]._M_pathname.field_2;
  while (local_4b8._M_string_length != local_508._M_string_length) {
    ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)&local_4b8);
    pcVar13 = (ppVar9->_M_pathname)._M_dataplus._M_p;
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,pcVar13,pcVar13 + (ppVar9->_M_pathname)._M_string_length);
    local_458 = (undefined1  [8])local_238[0]._M_pathname._M_string_length;
    paStack_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238[0]._M_pathname._M_dataplus._M_p;
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_458,
                       "_rse_workshop.dat");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_238[0]._M_pathname._M_dataplus._M_p,
                      local_238[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&local_4e8,ppVar9);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&local_4b8);
  }
  this_00 = &local_508;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)this_00);
  this = &local_4b8;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)this);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&stack0xfffffffffffffad8);
  ppVar6 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar15 = ((long)local_4e8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_4e8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar11 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar5,ppVar6);
    ppVar9 = local_4e8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = local_4e8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppVar5 = local_4e8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      ppVar9 != local_4e8.
                super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
    local_4e8.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
    pbVar10 = std::filesystem::__cxx11::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,ppVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar10 + -0x18) + (char)pbVar10);
    std::ostream::put((char)pbVar10);
    std::ostream::flush();
    ppVar4 = local_4e8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_4e8.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  std::ifstream::ifstream
            (local_238,
             ((local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_pathname)._M_dataplus._M_p,_S_in);
  local_470._M_ok = true;
  local_470._M_stream = (istream_type *)local_238;
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::_M_read(&local_470);
  local_258._M_stream = (istream_type *)0x0;
  local_258._M_value = 0.0;
  local_258._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&stack0xfffffffffffffab0,&local_470,&local_258
             ,(allocator_type *)local_458);
  local_508._M_dataplus._M_p = (pointer)0x0;
  local_458 = (undefined1  [8])&__pstl::execution::v1::par;
  puVar27 = &stack0xfffffffffffffacf;
  pvVar28 = &local_4d0;
  puVar29 = &stack0xffffffffffffface;
  puVar26 = &__pstl::execution::v1::par;
  __f.__first = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffab8;
  __f.__exec = (parallel_policy *)in_stack_fffffffffffffab0;
  __f.__last = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffac0;
  __f.__unary_op = (__no_op *)in_stack_fffffffffffffac8;
  __f.__init = (double *)in_stack_fffffffffffffad0;
  __f.__binary_op = (plus<double> *)in_stack_fffffffffffffab0;
  __f.__is_vector = (integral_constant<bool,_false> *)in_stack_fffffffffffffae0._M_pi;
  pcVar23 = &stack0xfffffffffffffad8;
  paStack_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&stack0xfffffffffffffad8;
  local_448 = this;
  puStack_440 = puVar27;
  local_438 = this_00;
  pvStack_430 = pvVar28;
  local_428 = puVar29;
  tVar20 = __pstl::__internal::
           __except_handler<__pstl::__internal::__pattern_transform_reduce<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,__pstl::__internal::__no_op,std::integral_constant<bool,false>>(__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,__pstl::__internal::__no_op,std::integral_constant<bool,false>,std::integral_constant<bool,true>)::_lambda()_1_>
                     (__f);
  peVar18 = in_stack_fffffffffffffab0;
  peVar19 = in_stack_fffffffffffffab8;
  dVar21 = __pstl::__internal::
           __pattern_transform_reduce<__pstl::execution::v1::parallel_unsequenced_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,std::multiplies<double>,std::integral_constant<bool,true>>
                     (0,&__pstl::execution::v1::par_unseq,in_stack_fffffffffffffab0,
                      in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_R8,in_R9,puVar26,
                      pcVar23,this,puVar27,this_00,pvVar28,puVar29);
  lVar17 = (long)in_stack_fffffffffffffab8 - (long)in_stack_fffffffffffffab0 >> 3;
  auVar24._8_4_ = (int)((long)in_stack_fffffffffffffab8 - (long)in_stack_fffffffffffffab0 >> 0x23);
  auVar24._0_8_ = lVar17;
  auVar24._12_4_ = 0x45300000;
  lVar11 = (long)peVar19 - (long)peVar18 >> 3;
  auVar25._8_4_ = (int)((long)peVar19 - (long)peVar18 >> 0x23);
  auVar25._0_8_ = lVar11;
  auVar25._12_4_ = 0x45300000;
  pcVar23 = (char *)(tVar20 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)));
  local_498 = dVar21 / ((auVar25._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) -
              (double)pcVar23 * (double)pcVar23;
  if (local_498 < 0.0) {
    dVar21 = sqrt(local_498);
  }
  else {
    dVar21 = SQRT(local_498);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mean:   ",8);
  poVar12 = std::ostream::_M_insert<double>((double)pcVar23);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_458,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"var:    ",8);
  poVar12 = std::ostream::_M_insert<double>(local_498);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_458,1);
  local_428._0_2_ = CONCAT11(1,(undefined1)local_428);
  local_458 = (undefined1  [8])0x0;
  local_4b8._M_dataplus._M_p = (pointer)&PTR_operator___0010fb80;
  _Var32._M_p = (pointer)peVar18;
  _Var33._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar19;
  local_518._M_allocated_capacity = (size_type)local_458;
  local_4b8._M_string_length = (size_type)&stack0xfffffffffffffad8;
  paStack_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar23;
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dVar21;
  local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar23;
  pvStack_430 = (vector<double,_std::allocator<double>_> *)dVar21;
  tbb::detail::r1::isolate_within_arena((delegate_base *)&local_4b8,0);
  auVar7 = local_458;
  peVar30 = peVar18;
  peVar31 = peVar19;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skew:   ",8);
  lVar11 = (long)peVar19 - (long)peVar18 >> 3;
  auVar22._8_4_ = (int)((long)peVar19 - (long)peVar18 >> 0x23);
  auVar22._0_8_ = lVar11;
  auVar22._12_4_ = 0x45300000;
  poVar12 = std::ostream::_M_insert<double>
                      ((double)auVar7 /
                       ((auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)));
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_458,1);
  pcVar13 = (pointer)std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector
            (&local_4d0,(vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffab0);
  peVar18 = (element_type *)
            ((ulong)((long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) >> 1);
  __pstl::__internal::
  __pattern_nth_element<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,std::integral_constant<bool,false>>
            (&__pstl::execution::v1::par,
             local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + (long)peVar18);
  if ((element_type *)
      ((long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) <= peVar18) {
    uVar14 = std::__throw_out_of_range_fmt
                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                        peVar18);
    if (local_508._M_dataplus._M_p != pcVar13) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)_Var32._M_p != peVar18) {
      operator_delete(_Var32._M_p,(ulong)(local_518._M_allocated_capacity + 1));
    }
    if (local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (peVar30 != (element_type *)0x0) {
      operator_delete(peVar30,(long)in_stack_fffffffffffffac0 - (long)peVar30);
    }
    std::ifstream::~ifstream(local_238);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    ~vector(&local_4e8);
    _Unwind_Resume(uVar14);
  }
  dVar2 = local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(long)peVar18];
  lVar11 = std::chrono::_V2::system_clock::now();
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median took ",0xc);
  poVar12 = std::ostream::_M_insert<double>((double)(lVar11 - (long)pcVar13) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median: ",8);
  poVar12 = std::ostream::_M_insert<double>(dVar2);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_458,1);
  lVar17 = (long)peVar31 - (long)peVar30 >> 3;
  lVar11 = 4;
  peVar18 = peVar30;
  if (lVar17 < 4) {
    lVar11 = lVar17;
  }
  do {
    if (peVar18 == peVar31) break;
    if (lVar11 < 1) {
      bVar8 = false;
    }
    else {
      bVar8 = true;
      lVar17 = 0;
      do {
        if (50.0 < *(double *)(peVar18 + lVar17 * 8)) {
          bVar8 = false;
        }
        lVar17 = lVar17 + 1;
      } while (lVar11 != lVar17);
      bVar8 = !bVar8;
    }
    if (!bVar8) {
      peVar18 = peVar18 + lVar11 * 8;
      lVar16 = (long)peVar31 - (long)peVar18 >> 3;
      lVar17 = lVar11 * 2;
      lVar3 = lVar11 * -2;
      lVar11 = lVar17;
      if (SBORROW8(lVar16,lVar17) != lVar16 + lVar3 < 0) {
        lVar11 = lVar16;
      }
    }
  } while (!bVar8);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Any greater than 50? ",0x15);
  poVar12 = std::ostream::_M_insert<bool>(true);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_458,1);
  peVar18 = peVar30 + 8;
  peVar19 = peVar30;
  if (peVar30 != peVar31 + -8) {
    do {
      peVar19 = peVar18;
      if (dVar21 + dVar21 <= ABS(*(double *)(peVar19 + -8) - *(double *)peVar19)) {
        peVar18 = peVar19;
        peVar19 = peVar19 + -8;
        break;
      }
      peVar18 = peVar19 + 8;
    } while (peVar19 != peVar31 + -8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position ",9);
  poVar12 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", first ",8);
  poVar12 = std::ostream::_M_insert<double>(*(double *)peVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," second: ",9);
  poVar12 = std::ostream::_M_insert<double>(*(double *)peVar18);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_458,1);
  _Var32._M_p = (pointer)&local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffad8,"./output","");
  std::operator+(&local_4b8,"mkdir -p ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffad8);
  system(local_4b8._M_dataplus._M_p);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,_Var32._M_p,(element_type *)(_Var33._M_pi + (long)_Var32._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_508,"/results.dat");
  std::ofstream::ofstream(local_458,(string *)&local_508,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  std::ostream::_M_insert<double>(*(double *)peVar30);
  if (8 < (ulong)((long)peVar31 - (long)peVar30)) {
    uVar15 = 1;
    do {
      local_508._M_dataplus._M_p._0_1_ = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,(char *)&local_508,1);
      std::ostream::_M_insert<double>(*(double *)(peVar30 + uVar15 * 8));
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)peVar31 - (long)peVar30 >> 3));
  }
  std::ofstream::close();
  local_458 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_458 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&paStack_450);
  std::ios_base::~ios_base(local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var32._M_p != &local_518) {
    operator_delete(_Var32._M_p,(ulong)(local_518._M_allocated_capacity + 1));
  }
  if (local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (peVar30 != (element_type *)0x0) {
    operator_delete(peVar30,(long)in_stack_fffffffffffffac0 - (long)peVar30);
  }
  std::ifstream::~ifstream(local_238);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_4e8);
  return 0;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(std::execution::par, v.begin(), v.end(), 0.0) / v.size();
    const double var =
        std::transform_reduce(std::execution::par_unseq, v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew =
        std::transform_reduce(std::execution::par, v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    auto half_way = v2.size() / 2;
    std::nth_element(std::execution::par, v2.begin(), std::next(v2.begin(), half_way), v2.end());
    const double median = v2.at(half_way);

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Any of the elements > 50?
    const bool any_greater_than_50 =
        std::any_of(std::execution::unseq, v.begin(), v.end(), [](const double x) { return x > 50.0; });
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    auto comparison = [std](const double x, const double y) { return std::fabs(x - y) < 2.0 * std; };
    const auto answer = std::mismatch(v.begin(), std::prev(v.end()), std::next(v.begin()), comparison);

    const auto dist = std::distance(v.begin(), answer.first);
    std::cout << "Position " << dist << ", first " << *answer.first << " second: " << *answer.second << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}